

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# log4z.cpp
# Opt level: O2

void zsummer::log4z::GetProcessInfo(string *name,string *pid)

{
  bool bVar1;
  uint uVar2;
  long lVar3;
  CLog4zFile i;
  string local_148 [32];
  char buf [260];
  
  std::__cxx11::string::assign((char *)name);
  std::__cxx11::string::assign((char *)pid);
  uVar2 = getpid();
  sprintf(buf,"/proc/%d/cmdline",(ulong)uVar2);
  i.m_file = (FILE *)0x0;
  CLog4zFile::Open(&i,buf,"r");
  if (i.m_file != (FILE *)0x0) {
    bVar1 = CLog4zFile::ReadLine(&i,buf,0x103);
    if (bVar1) {
      std::__cxx11::string::assign((char *)name);
    }
    CLog4zFile::Close(&i);
    lVar3 = std::__cxx11::string::rfind((char *)name,0x12d92b);
    if (lVar3 != -1) {
      std::__cxx11::string::substr((ulong)local_148,(ulong)name);
      std::__cxx11::string::operator=((string *)name,local_148);
      std::__cxx11::string::~string(local_148);
    }
    sprintf(buf,"%06d",(ulong)uVar2);
    std::__cxx11::string::assign((char *)pid);
  }
  CLog4zFile::~CLog4zFile(&i);
  return;
}

Assistant:

void GetProcessInfo(std::string &name, std::string &pid)
{
	name = "MainLog";
	pid = "0";
#ifdef WIN32

	char buf[260] = {0};
	if (GetModuleFileNameA(NULL, buf, 259) > 0)
	{
		name = buf;
	}
	std::string::size_type pos = name.rfind("\\");
	if (pos != std::string::npos)
	{
		name = name.substr(pos+1, std::string::npos);
	}
	pos = name.rfind(".");
	if (pos != std::string::npos)
	{
		name = name.substr(0, pos-0);
	}
	DWORD pidd = GetCurrentProcessId();
	sprintf(buf, "%06d", pidd);
	pid = buf;
#else
	pid_t id = getpid();
	char buf[260];
	sprintf(buf, "/proc/%d/cmdline", (int)id);
	CLog4zFile i;
	i.Open(buf, "r");
	if (!i.IsOpen())
	{
		return ;
	}
	if (i.ReadLine(buf, 259))
	{
		name = buf;
	}
	i.Close();

	std::string::size_type pos = name.rfind("/");
	if (pos != std::string::npos)
	{
		name = name.substr(pos+1, std::string::npos);
	}
	sprintf(buf, "%06d", id);
	pid = buf;
#endif
}